

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

string * __thiscall
Assimp::ColladaParser::ReadZaeManifest_abi_cxx11_
          (string *__return_storage_ptr__,ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  int iVar1;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *pIVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  allocator<char> local_459;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  aiString ai_str;
  
  _stream = (IOStream *)
            (**(code **)((this->mFileName)._M_dataplus._M_p + 0x20))(this,"manifest.xml","rb");
  if (_stream == (IOStream *)0x0) {
    file_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    file_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&ai_str,"dae",&local_459);
    ZipArchiveIOSystem::getFileListExtension
              ((ZipArchiveIOSystem *)this,&file_list,(string *)&ai_str);
    std::__cxx11::string::~string((string *)&ai_str);
    if (file_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        file_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)
                 file_list.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_list);
    return __return_storage_ptr__;
  }
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  pIVar2 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  do {
    do {
      iVar1 = (*pIVar2->_vptr_IIrrXMLReader[2])(pIVar2);
      if ((char)iVar1 == '\0') goto LAB_003f6fdc;
      iVar1 = (*pIVar2->_vptr_IIrrXMLReader[3])(pIVar2);
    } while (iVar1 != 1);
    iVar1 = (*pIVar2->_vptr_IIrrXMLReader[0xd])(pIVar2);
    iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"dae_root");
  } while (iVar1 != 0);
  iVar1 = (*pIVar2->_vptr_IIrrXMLReader[2])(pIVar2);
  if (((char)iVar1 != '\0') &&
     ((iVar1 = (*pIVar2->_vptr_IIrrXMLReader[3])(pIVar2), iVar1 == 3 ||
      (iVar1 = (*pIVar2->_vptr_IIrrXMLReader[3])(pIVar2), iVar1 == 5)))) {
    iVar1 = (*pIVar2->_vptr_IIrrXMLReader[0xe])(pIVar2);
    if ((char *)CONCAT44(extraout_var_00,iVar1) != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&file_list,(char *)CONCAT44(extraout_var_00,iVar1),&local_459);
      __n = 0x3ff;
      if (((ulong)file_list.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish & 0xfffffc00) == 0) {
        __n = (ulong)file_list.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff;
      }
      ai_str.length = (ai_uint32)__n;
      memcpy(ai_str.data,
             file_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,__n);
      ai_str.data[__n] = '\0';
      std::__cxx11::string::~string((string *)&file_list);
      UriDecodePath(&ai_str);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,ai_str.data,(allocator<char> *)&file_list);
      goto LAB_003f6fed;
    }
  }
LAB_003f6fdc:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_003f6fed:
  (*pIVar2->_vptr_IIrrXMLReader[1])(pIVar2);
  (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
  (*_stream->_vptr_IOStream[1])(_stream);
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaParser::ReadZaeManifest(ZipArchiveIOSystem &zip_archive) {
    // Open the manifest
    std::unique_ptr<IOStream> manifestfile(zip_archive.Open("manifest.xml"));
    if (manifestfile == nullptr)
    {
        // No manifest, hope there is only one .DAE inside
        std::vector<std::string> file_list;
        zip_archive.getFileListExtension(file_list, "dae");

        if (file_list.empty())
            return std::string();

        return file_list.front();
    }

    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(manifestfile.get()));
    std::unique_ptr<irr::io::IrrXMLReader> manifest_reader(irr::io::createIrrXMLReader(mIOWrapper.get()));

    while (manifest_reader->read())
    {
        // find the manifest "dae_root" element
        if (manifest_reader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (::strcmp(manifest_reader->getNodeName(), "dae_root") == 0)
            {
                if (!manifest_reader->read())
                    return std::string();
                if (manifest_reader->getNodeType() != irr::io::EXN_TEXT && manifest_reader->getNodeType() != irr::io::EXN_CDATA)
                    return std::string();

                const char* filepath = manifest_reader->getNodeData();
                if (filepath == nullptr)
                    return std::string();

                aiString ai_str(filepath);
                UriDecodePath(ai_str);

                return std::string(ai_str.C_Str());
            }
        }
    }
    return std::string();
}